

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmpseq.c
# Opt level: O2

sd_lookup_t * sd_find_seq(char *str,int use_header)

{
  UT_hash_table *pUVar1;
  UT_hash_handle *pUVar2;
  int iVar3;
  size_t __n;
  byte *pbVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  sd_lookup_t *psVar10;
  
  psVar10 = sd_lookup;
  if (sd_lookup != (sd_lookup_t *)0x0) {
    __n = strlen(str);
    pbVar4 = (byte *)(str + 10);
    uVar9 = 0x9e3779b9;
    uVar5 = 0xfeedbeef;
    uVar6 = 0x9e3779b9;
    uVar8 = __n & 0xffffffff;
    while (uVar7 = (uint)uVar8, 0xb < uVar7) {
      uVar5 = uVar5 + *(int *)(pbVar4 + -2);
      uVar9 = uVar5 >> 0xd ^
              ((uVar9 + *(int *)(pbVar4 + -10)) - (uVar6 + *(int *)(pbVar4 + -6))) - uVar5;
      uVar6 = uVar9 << 8 ^ ((uVar6 + *(int *)(pbVar4 + -6)) - uVar5) - uVar9;
      uVar5 = uVar6 >> 0xd ^ (uVar5 - uVar9) - uVar6;
      uVar9 = uVar5 >> 0xc ^ (uVar9 - uVar6) - uVar5;
      uVar6 = uVar9 << 0x10 ^ (uVar6 - uVar5) - uVar9;
      uVar5 = uVar6 >> 5 ^ (uVar5 - uVar9) - uVar6;
      uVar9 = uVar5 >> 3 ^ (uVar9 - uVar6) - uVar5;
      uVar6 = uVar9 << 10 ^ (uVar6 - uVar5) - uVar9;
      uVar5 = uVar6 >> 0xf ^ (uVar5 - uVar9) - uVar6;
      pbVar4 = pbVar4 + 0xc;
      uVar8 = (ulong)(uVar7 - 0xc);
    }
    uVar5 = uVar5 + (int)__n;
    switch(uVar7) {
    case 0xb:
      uVar5 = (uint)*pbVar4 * 0x1000000 + uVar5;
    case 10:
      uVar5 = (uint)pbVar4[-1] * 0x10000 + uVar5;
    case 9:
      uVar5 = (uint)pbVar4[-2] * 0x100 + uVar5;
    case 8:
      uVar6 = (uint)pbVar4[-3] * 0x1000000 + uVar6;
    case 7:
      uVar6 = (uint)pbVar4[-4] * 0x10000 + uVar6;
    case 6:
      uVar6 = (uint)pbVar4[-5] * 0x100 + uVar6;
    case 5:
      uVar6 = pbVar4[-6] + uVar6;
    case 4:
      uVar9 = (uint)pbVar4[-7] * 0x1000000 + uVar9;
    case 3:
      uVar9 = (uint)pbVar4[-8] * 0x10000 + uVar9;
    case 2:
      uVar9 = (uint)pbVar4[-9] * 0x100 + uVar9;
    case 1:
      uVar9 = pbVar4[-10] + uVar9;
    default:
      uVar9 = uVar5 >> 0xd ^ (uVar9 - uVar5) - uVar6;
      uVar7 = uVar9 << 8 ^ (uVar6 - uVar5) - uVar9;
      uVar6 = uVar7 >> 0xd ^ (uVar5 - uVar9) - uVar7;
      uVar5 = uVar6 >> 0xc ^ (uVar9 - uVar7) - uVar6;
      uVar9 = uVar5 << 0x10 ^ (uVar7 - uVar6) - uVar5;
      uVar6 = uVar9 >> 5 ^ (uVar6 - uVar5) - uVar9;
      uVar5 = uVar6 >> 3 ^ (uVar5 - uVar9) - uVar6;
      uVar9 = uVar5 << 10 ^ (uVar9 - uVar6) - uVar5;
      pUVar1 = (psVar10->hh).tbl;
      pUVar2 = pUVar1->buckets[pUVar1->num_buckets - 1 & (uVar9 >> 0xf ^ uVar6 - (uVar5 + uVar9))].
               hh_head;
      if (pUVar2 == (UT_hash_handle *)0x0) {
        psVar10 = (sd_lookup_t *)0x0;
      }
      else {
        psVar10 = (sd_lookup_t *)((long)pUVar2 - pUVar1->hho);
      }
    }
    while (psVar10 != (sd_lookup_t *)0x0) {
      if ((__n == (psVar10->hh).keylen) && (iVar3 = bcmp((psVar10->hh).key,str,__n), iVar3 == 0)) {
        return psVar10;
      }
      pUVar2 = (psVar10->hh).hh_next;
      psVar10 = (sd_lookup_t *)0x0;
      if (pUVar2 != (UT_hash_handle *)0x0) {
        psVar10 = (sd_lookup_t *)((long)pUVar2 - pUVar1->hho);
      }
    }
  }
  return (sd_lookup_t *)0x0;
}

Assistant:

sd_lookup_t *sd_find_seq(char *str, int use_header)
{
	sd_lookup_t *s;
	HASH_FIND_STR(sd_lookup, str, s);
	if (s)
		return s;
	else
		return (sd_lookup_t *)NULL;
}